

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

void bio_write(opj_bio_t *bio,int v,int n)

{
  int b;
  int in_EDX;
  undefined4 in_ESI;
  int i;
  
  for (b = in_EDX + -1; -1 < b; b = b + -1) {
    bio_putbit((opj_bio_t *)CONCAT44(in_ESI,in_EDX),b);
  }
  return;
}

Assistant:

void bio_write(opj_bio_t *bio, int v, int n) {
	int i;
	for (i = n - 1; i >= 0; i--) {
		bio_putbit(bio, (v >> i) & 1);
	}
}